

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoderTests.cpp
# Opt level: O1

void __thiscall
DecoderTestsFixture_failed_reserve_resources_Test::TestBody
          (DecoderTestsFixture_failed_reserve_resources_Test *this)

{
  linked_ptr_internal *plVar1;
  bool bVar2;
  MockSpec<void_*(unsigned_long)> *this_00;
  TypedExpectation<void_*(unsigned_long)> *this_01;
  ResourceSystemMock *this_02;
  char *message;
  AssertionResult gtest_ar;
  linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_> local_f8;
  ActionInterface<void_*(unsigned_long)> local_e8 [2];
  undefined4 local_d8;
  Matcher<unsigned_long> local_d0;
  undefined4 local_b0;
  char local_a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  string local_98;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  undefined4 local_58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_50;
  
  this_02 = &(this->super_DecoderTestsFixture).rs;
  local_d0.super_MatcherBase<unsigned_long>.impl_.value_ =
       (MatcherInterface<unsigned_long> *)operator_new(8);
  ((local_d0.super_MatcherBase<unsigned_long>.impl_.value_)->super_MatcherDescriberInterface).
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherDescriberInterface_00167a10;
  plVar1 = &local_d0.super_MatcherBase<unsigned_long>.impl_.link_;
  local_d0.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001678c0;
  local_d0.super_MatcherBase<unsigned_long>.impl_.link_.next_ = plVar1;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_02,this_02);
  this_00 = testing::internal::FunctionMocker<void_*(unsigned_long)>::With
                      (&this_02->gmockconst1_Resource_Reserve_11,&local_d0);
  this_01 = testing::internal::MockSpec<void_*(unsigned_long)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]How-to-mock-free-function/DecoderTests.cpp"
                       ,0x11,"rs","Resource_Reserve(_)");
  local_f8.value_ = (ActionInterface<void_*(unsigned_long)> *)operator_new(0x10);
  (local_f8.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00167be8;
  local_f8.value_[1]._vptr_ActionInterface = (_func_int **)0x0;
  local_f8.link_.next_ = &local_f8.link_;
  testing::internal::TypedExpectation<void_*(unsigned_long)>::WillRepeatedly
            (this_01,(Action<void_*(unsigned_long)> *)&local_f8);
  testing::internal::linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_>::~linked_ptr
            (&local_f8);
  local_d0.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00167908;
  testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::~linked_ptr
            (&local_d0.super_MatcherBase<unsigned_long>.impl_);
  message = "";
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"","");
  local_58 = 0xffffffff;
  local_f8.value_ = local_e8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_78,local_78 + local_70);
  local_d8 = local_58;
  local_d0.super_MatcherBase<unsigned_long>._vptr_MatcherBase = (_func_int **)plVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_f8.value_,
             (long)&(local_f8.value_)->_vptr_ActionInterface + (long)&(local_f8.link_.next_)->next_)
  ;
  local_b0 = local_d8;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"message which needs too much resources","");
  Decoder::decode(&local_50,&local_98);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::EqMatcher<std::pair<std::__cxx11::string,int>>>::
  operator()(local_a8,(char *)&local_d0,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)"Decoder::decode(\"message which needs too much resources\")");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != &local_50.first.field_2) {
    operator_delete(local_50.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((linked_ptr_internal *)local_d0.super_MatcherBase<unsigned_long>._vptr_MatcherBase != plVar1)
  {
    operator_delete(local_d0.super_MatcherBase<unsigned_long>._vptr_MatcherBase);
  }
  if (local_f8.value_ != local_e8) {
    operator_delete(local_f8.value_);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (local_a8[0] == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if (local_a0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((local_a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]How-to-mock-free-function/DecoderTests.cpp"
               ,0x13,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((linked_ptr_internal *)local_d0.super_MatcherBase<unsigned_long>._vptr_MatcherBase !=
        (linked_ptr_internal *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((linked_ptr_internal *)local_d0.super_MatcherBase<unsigned_long>._vptr_MatcherBase !=
          (linked_ptr_internal *)0x0)) {
        (*(code *)(*(linked_ptr_internal **)
                    local_d0.super_MatcherBase<unsigned_long>._vptr_MatcherBase)[1].next_)();
      }
      local_d0.super_MatcherBase<unsigned_long>._vptr_MatcherBase = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(DecoderTestsFixture, failed_reserve_resources)
{
	EXPECT_CALL(rs, Resource_Reserve(_)).WillRepeatedly(Return(nullptr));

	ASSERT_THAT(Decoder::decode("message which needs too much resources"), Eq(ValueWithError("", -1)));
}